

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O2

string_t * __thiscall
cfgfile::
tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
::print(string_t *__return_storage_ptr__,
       tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
       *this,int indent)

{
  undefined8 *puVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char cVar4;
  char cVar5;
  long lVar6;
  long lVar7;
  undefined8 *puVar8;
  string_t spaces;
  string_t value;
  string_t tmp;
  string_t local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar2 = tag_t<cfgfile::string_trait_t>::is_defined(&this->super_tag_t<cfgfile::string_trait_t>);
  if (bVar2) {
    value._M_dataplus._M_p = (pointer)&value.field_2;
    cVar4 = (char)indent;
    std::__cxx11::string::_M_construct((ulong)&value,cVar4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&value);
    cVar5 = (char)__return_storage_ptr__;
    std::__cxx11::string::push_back(cVar5);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::push_back(cVar5);
    std::__cxx11::string::string((string *)&value,(string *)&this->m_value);
    lVar7 = (ulong)(value._M_string_length % 0x50 != 0) + value._M_string_length / 0x50;
    if (lVar7 == 0) {
      std::__cxx11::string::push_back(cVar5);
      std::__cxx11::string::push_back(cVar5);
    }
    else {
      spaces._M_dataplus._M_p = (pointer)&spaces.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&spaces,
                 (char)(this->super_tag_t<cfgfile::string_trait_t>).m_name._M_string_length + '\x02'
                );
      for (lVar6 = 0; lVar7 != lVar6; lVar6 = lVar6 + 1) {
        if (lVar6 != 0) {
          std::__cxx11::string::push_back(cVar5);
          tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
          std::__cxx11::string::_M_construct((ulong)&tmp,cVar4);
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&tmp);
          std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        std::__cxx11::string::substr((ulong)&local_50,(ulong)&value);
        to_cfgfile_format<cfgfile::string_trait_t>(&tmp,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&tmp);
      }
      std::__cxx11::string::~string((string *)&spaces);
    }
    iVar3 = (*(this->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t[2])(this);
    if (*(long *)CONCAT44(extraout_var,iVar3) != ((long *)CONCAT44(extraout_var,iVar3))[1]) {
      std::__cxx11::string::push_back(cVar5);
      iVar3 = (*(this->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t[2])(this);
      puVar1 = (undefined8 *)((undefined8 *)CONCAT44(extraout_var_00,iVar3))[1];
      for (puVar8 = *(undefined8 **)CONCAT44(extraout_var_00,iVar3); puVar8 != puVar1;
          puVar8 = puVar8 + 1) {
        (**(code **)(*(long *)*puVar8 + 0x18))(&spaces,(long *)*puVar8,indent + 1);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&spaces);
      }
      spaces._M_dataplus._M_p = (pointer)&spaces.field_2;
      std::__cxx11::string::_M_construct((ulong)&spaces,cVar4);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&spaces);
    }
    std::__cxx11::string::push_back(cVar5);
    std::__cxx11::string::push_back(cVar5);
    std::__cxx11::string::~string((string *)&value);
  }
  return __return_storage_ptr__;
}

Assistant:

typename Trait::string_t print( int indent = 0 ) const override
	{
		typename Trait::string_t result;

		if( this->is_defined() )
		{
			result.append( typename Trait::string_t( indent,
				const_t< Trait >::c_tab ) );

			result.push_back( const_t< Trait >::c_begin_tag );
			result.append( this->name() );
			result.push_back( const_t< Trait >::c_space );

			typename Trait::string_t value =
				format_t< typename Trait::string_t, Trait >::to_string( m_value );

			const typename Trait::pos_t sections =
				( value.length() / c_max_string_length +
				( value.length() % c_max_string_length > 0 ? 1 : 0 ) );

			if( sections )
			{
				const typename Trait::string_t spaces =
					typename Trait::string_t( this->name().length() + 2,
						const_t< Trait >::c_space );

				for( typename Trait::pos_t i = 0; i < sections; ++i )
				{
					if( i > 0 )
					{
						result.push_back( const_t< Trait >::c_carriage_return );

						result.append( typename Trait::string_t( indent,
							const_t< Trait >::c_tab ) );

						result.append( spaces );
					}

					const typename Trait::string_t tmp =
						to_cfgfile_format< Trait > (
							value.substr( i * c_max_string_length,
								c_max_string_length ) );

					result.append( tmp );
				}
			}
			else
			{
				result.push_back( const_t< Trait >::c_quotes );
				result.push_back( const_t< Trait >::c_quotes );
			}

			if( !this->children().empty() )
			{
				result.push_back( const_t< Trait >::c_carriage_return );

				for( const tag_t< Trait > * tag : this->children() )
					result.append( tag->print( indent + 1 ) );

				result.append( typename Trait::string_t( indent,
					const_t< Trait >::c_tab ) );
			}

			result.push_back( const_t< Trait >::c_end_tag );
			result.push_back( const_t< Trait >::c_carriage_return );
		}

		return result;
	}